

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.c
# Opt level: O0

apx_vm_writeState_t * apx_vm_writeState_new(void)

{
  apx_vm_writeState_t *self_00;
  apx_vm_writeState_t *self;
  
  self_00 = (apx_vm_writeState_t *)malloc(0x50);
  if (self_00 != (apx_vm_writeState_t *)0x0) {
    apx_vm_writeState_create(self_00);
  }
  return self_00;
}

Assistant:

apx_vm_writeState_t* apx_vm_writeState_new(void)
{
   apx_vm_writeState_t* self = (apx_vm_writeState_t*)malloc(sizeof(apx_vm_writeState_t));
   if (self != NULL)
   {
      apx_vm_writeState_create(self);
   }
   return self;
}